

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void refreshMultiLine(linenoiseState *l,int flags)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *__dest;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  linenoiseState *plVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  size_t __size;
  char seq [64];
  char *local_b8;
  abuf local_b0;
  uint local_9c;
  linenoiseState *local_98;
  int local_8c;
  undefined8 local_88;
  size_t local_80;
  undefined8 local_78;
  undefined2 local_70;
  
  pcVar12 = l->prompt;
  local_9c = flags;
  sVar7 = strlen(pcVar12);
  sVar8 = promptTextColumnLen(pcVar12,sVar7);
  sVar9 = columnPosForMultiLine(l->buf,l->len,l->len,l->cols,sVar8);
  uVar14 = l->cols;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (sVar9 + uVar14 + sVar8) - 1;
  local_88 = SUB168(auVar5 / auVar4,0);
  iVar20 = (int)l->oldrows;
  local_8c = l->ofd;
  l->oldrows = (long)SUB164(auVar5 / auVar4,0);
  local_b0.b = (char *)0x0;
  local_b0.len = 0;
  uVar1 = l->oldcollen;
  uVar2 = l->len;
  local_98 = l;
  local_80 = sVar8;
  if (((uVar1 < uVar2) && (l->pos <= uVar14 && l->pos == uVar2)) &&
     (l->prev_history_index == l->history_index)) {
    pcVar12 = l->buf;
    sVar7 = strlen(pcVar12);
    iVar20 = (int)sVar7 - (int)uVar1;
    __dest = malloc((long)iVar20);
    if (__dest == (void *)0x0) {
      sVar7 = 0;
    }
    else {
      memcpy(__dest,pcVar12 + uVar1,(long)iVar20);
      sVar7 = (size_t)iVar20;
    }
    plVar15 = local_98;
    local_98->oldcolpos = sVar9;
    local_98->oldcollen = uVar2;
    write(local_8c,__dest,sVar7);
    free(__dest);
    plVar15->prev_history_index = plVar15->history_index;
    return;
  }
  if ((local_9c & 1) == 0) goto LAB_0010ace2;
  if ((int)((uVar14 + sVar8 + l->oldcolpos) / uVar14) < iVar20) {
    snprintf((char *)&local_78,0x40,"\x1b[%dB");
    sVar7 = strlen((char *)&local_78);
    iVar16 = (int)sVar7;
    local_b8 = (char *)malloc((long)iVar16);
    if (local_b8 == (char *)0x0) goto LAB_0010ac5f;
    memcpy(local_b8,&local_78,(long)iVar16);
    uVar14 = sVar7 & 0xffffffff;
    local_b0.len = iVar16;
  }
  else {
LAB_0010ac5f:
    uVar14 = 0;
    local_b8 = (char *)0x0;
  }
  iVar16 = (int)uVar14;
  if (1 < iVar20) {
    iVar20 = iVar20 + -1;
    do {
      local_78 = 0x315b1b4b305b1b0d;
      local_70 = 0x41;
      sVar7 = strlen((char *)&local_78);
      uVar18 = (int)sVar7 + (int)uVar14;
      pcVar12 = (char *)realloc(local_b8,(long)(int)uVar18);
      if (pcVar12 != (char *)0x0) {
        memcpy(pcVar12 + (int)uVar14,&local_78,(long)(int)sVar7);
        uVar14 = (ulong)uVar18;
        local_b8 = pcVar12;
      }
      iVar16 = (int)uVar14;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  local_b0.b = local_b8;
  local_b0.len = iVar16;
LAB_0010ace2:
  plVar15 = local_98;
  iVar20 = local_b0.len;
  pcVar12 = local_b0.b;
  if ((local_9c & 3) != 0) {
    local_78 = CONCAT26(local_78._6_2_,0x4b00000000);
    local_78 = CONCAT44(local_78._4_4_,0x305b1b0d);
    sVar7 = strlen((char *)&local_78);
    iVar16 = iVar20 + (int)sVar7;
    pcVar10 = (char *)realloc(pcVar12,(long)iVar16);
    if (pcVar10 != (char *)0x0) {
      memcpy(pcVar10 + iVar20,&local_78,(long)(int)sVar7);
      pcVar12 = pcVar10;
      iVar20 = iVar16;
      local_b0.b = pcVar10;
      local_b0.len = iVar16;
    }
  }
  sVar8 = columnPosForMultiLine(plVar15->buf,plVar15->len,plVar15->pos,plVar15->cols,local_80);
  iVar16 = (int)sVar8;
  if ((local_9c & 2) != 0) {
    pcVar10 = plVar15->prompt;
    sVar7 = strlen(pcVar10);
    iVar13 = iVar20 + (int)sVar7;
    pcVar11 = (char *)realloc(pcVar12,(long)iVar13);
    if (pcVar11 != (char *)0x0) {
      memcpy(pcVar11 + iVar20,pcVar10,(long)(int)sVar7);
      pcVar12 = pcVar11;
      iVar20 = iVar13;
      local_b0.b = pcVar11;
      local_b0.len = iVar13;
    }
    plVar15 = local_98;
    if (maskmode == '\x01') {
      iVar6 = iVar20;
      if (local_98->len != 0) {
        uVar14 = 1;
        do {
          pcVar10 = (char *)realloc(pcVar12,(long)(iVar20 + 1));
          if (pcVar10 != (char *)0x0) {
            pcVar10[iVar20] = '*';
            pcVar12 = pcVar10;
            iVar20 = iVar20 + 1;
          }
          bVar3 = uVar14 < plVar15->len;
          uVar14 = (ulong)((int)uVar14 + 1);
          iVar6 = iVar20;
        } while (bVar3);
      }
    }
    else {
      pcVar10 = local_98->buf;
      iVar13 = (int)local_98->len;
      iVar19 = iVar20 + iVar13;
      pcVar11 = (char *)realloc(pcVar12,(long)iVar19);
      pcVar12 = local_b0.b;
      iVar6 = local_b0.len;
      if (pcVar11 != (char *)0x0) {
        memcpy(pcVar11 + iVar20,pcVar10,(long)iVar13);
        pcVar12 = pcVar11;
        iVar6 = iVar19;
      }
    }
    local_b0.len = iVar6;
    local_b0.b = pcVar12;
    sVar8 = local_80;
    plVar15 = local_98;
    refreshShowHints(&local_b0,local_98,(int)local_80);
    iVar13 = local_b0.len;
    pcVar12 = local_b0.b;
    iVar20 = (int)local_88;
    if (((plVar15->pos != 0) && (plVar15->pos == plVar15->len)) &&
       (((long)iVar16 + sVar8) % plVar15->cols == 0)) {
      lVar17 = (long)local_b0.len;
      sVar7 = lVar17 + 1;
      pcVar10 = (char *)realloc(local_b0.b,sVar7);
      if (pcVar10 != (char *)0x0) {
        pcVar10[lVar17] = '\n';
        iVar13 = (int)sVar7;
        pcVar12 = pcVar10;
        local_b0.b = pcVar10;
        local_b0.len = iVar13;
      }
      local_78 = CONCAT62(local_78._2_6_,0xd);
      sVar7 = strlen((char *)&local_78);
      iVar20 = (int)sVar7 + iVar13;
      pcVar12 = (char *)realloc(pcVar12,(long)iVar20);
      if (pcVar12 != (char *)0x0) {
        memcpy(pcVar12 + iVar13,&local_78,(long)(int)sVar7);
        local_b0.b = pcVar12;
        local_b0.len = iVar20;
      }
      iVar20 = (int)local_88 + 1;
      plVar15 = local_98;
      sVar8 = local_80;
      if ((int)local_98->oldrows <= (int)local_88) {
        local_98->oldrows = (long)iVar20;
      }
    }
    if ((int)((plVar15->cols + sVar8 + (long)iVar16) / plVar15->cols) < iVar20) {
      snprintf((char *)&local_78,0x40,"\x1b[%dA");
      sVar7 = strlen((char *)&local_78);
      lVar17 = (long)local_b0.len;
      __size = (int)sVar7 + lVar17;
      pcVar12 = (char *)realloc(local_b0.b,__size);
      if (pcVar12 != (char *)0x0) {
        memcpy(pcVar12 + lVar17,&local_78,(long)(int)sVar7);
        local_b0.len = (int)__size;
        local_b0.b = pcVar12;
      }
    }
    plVar15 = local_98;
    if ((int)((sVar8 + (long)iVar16) % local_98->cols) == 0) {
      local_78 = CONCAT62(local_78._2_6_,0xd);
    }
    else {
      snprintf((char *)&local_78,0x40,"\r\x1b[%dC");
    }
    sVar7 = strlen((char *)&local_78);
    iVar20 = local_b0.len;
    pcVar12 = local_b0.b;
    iVar13 = local_b0.len + (int)sVar7;
    pcVar10 = (char *)realloc(local_b0.b,(long)iVar13);
    if (pcVar10 != (char *)0x0) {
      memcpy(pcVar10 + iVar20,&local_78,(long)(int)sVar7);
      pcVar12 = pcVar10;
      iVar20 = iVar13;
    }
  }
  plVar15->oldcolpos = (long)iVar16;
  plVar15->oldcollen = plVar15->len;
  plVar15->prev_history_index = plVar15->history_index;
  write(local_8c,pcVar12,(long)iVar20);
  free(pcVar12);
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t pcollen = promptTextColumnLen(l->prompt,strlen(l->prompt));
    size_t colpos = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int colpos2; /* cursor column position. */
    int rows = (pcollen+colpos+l->cols-1)/l->cols; /* rows used by current buf. */
    int rpos = (pcollen+l->oldcolpos+l->cols)/l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int col; /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    struct abuf ab;

    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    abInit(&ab);

    if ((l->oldcollen < l->len) && // some character was added
            (l->pos == l->len) && // at the end of the line
            (l->pos <= l->cols) && // no multiline break
            (l->prev_history_index == l->history_index) // no buffer change based on history
            ) {
        /* Ignore flags and just add one character.
         * This code was added because redundant ANSI escape codes make tcl-tests incapable.
         */
        abAppend(&ab,l->buf + l->oldcollen,strlen(l->buf) - l->oldcollen);
        l->oldcolpos = colpos;
        l->oldcollen = l->len;
        if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
        abFree(&ab);
        l->prev_history_index = l->history_index;
        return;
    }

    if (flags & REFRESH_CLEAN) {
        if (old_rows-rpos > 0) {
            lndebug("go down %d", old_rows-rpos);
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows-1; j++) {
            lndebug("clear+up");
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            abAppend(&ab,seq,strlen(seq));
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        lndebug("clear");
        snprintf(seq,64,"\r\x1b[0K");
        abAppend(&ab,seq,strlen(seq));
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf,l->len,l->pos,l->cols,pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        abAppend(&ab,l->prompt,strlen(l->prompt));
        if (maskmode == 1) {
            unsigned int i;
            for (i = 0; i < l->len; i++) abAppend(&ab,"*",1);
        } else {
            abAppend(&ab,l->buf,l->len);
        }

        /* Show hits if any. */
        refreshShowHints(&ab,l,pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos &&
            l->pos == l->len &&
            (colpos2+pcollen) % l->cols == 0)
        {
            lndebug("<newline>");
            abAppend(&ab,"\n",1);
            snprintf(seq,64,"\r");
            abAppend(&ab,seq,strlen(seq));
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen+colpos2+l->cols)/l->cols; /* Current cursor relative row */
        lndebug("rpos2 %d", rpos2);

        /* Go up till we reach the expected position. */
        if (rows-rpos2 > 0) {
            lndebug("go-up %d", rows-rpos2);
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            abAppend(&ab,seq,strlen(seq));
        }

        /* Set column. */
        col = (pcollen+colpos2) % l->cols;
        lndebug("set col %d", 1+col);
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        abAppend(&ab,seq,strlen(seq));
    }

    lndebug("\n");
    l->oldcolpos = colpos2;
    l->oldcollen = l->len;
    l->prev_history_index = l->history_index;

    if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
    abFree(&ab);
}